

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commit_state.cpp
# Opt level: O2

void __thiscall duckdb::CommitState::RevertCommit(CommitState *this,UndoFlags type,data_ptr_t data)

{
  transaction_t commit_id;
  CatalogEntry *this_00;
  bool bVar1;
  CatalogEntry *pCVar2;
  InternalException *this_01;
  UpdateInfo *info;
  allocator local_41;
  string local_40;
  
  if (4 < type - CATALOG_ENTRY) {
    this_01 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_40,"UndoBuffer - don\'t know how to revert commit of this type!",
               &local_41);
    InternalException::InternalException(this_01,&local_40);
    __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  commit_id = this->commit_id;
  switch(type) {
  case CATALOG_ENTRY:
    this_00 = *(CatalogEntry **)data;
    pCVar2 = CatalogEntry::Parent(this_00);
    CatalogSet::UpdateTimestamp(pCVar2,commit_id);
    pCVar2 = CatalogEntry::Parent(this_00);
    bVar1 = ::std::operator!=(&this_00->name,&pCVar2->name);
    if (bVar1) {
      CatalogSet::UpdateTimestamp(this_00,commit_id);
      return;
    }
    break;
  case INSERT_TUPLE:
    DataTable::RevertAppend
              (*(DataTable **)data,this->transaction,*(idx_t *)(data + 8),*(idx_t *)(data + 0x10));
    return;
  case DELETE_TUPLE:
    RowVersionManager::CommitDelete
              (*(RowVersionManager **)(data + 8),*(idx_t *)(data + 0x10),commit_id,
               (DeleteInfo *)data);
    return;
  case UPDATE_TUPLE:
    LOCK();
    *(transaction_t *)(data + 0x10) = commit_id;
    UNLOCK();
  }
  return;
}

Assistant:

void CommitState::RevertCommit(UndoFlags type, data_ptr_t data) {
	transaction_t transaction_id = commit_id;
	switch (type) {
	case UndoFlags::CATALOG_ENTRY: {
		// set the commit timestamp of the catalog entry to the given id
		auto catalog_entry = Load<CatalogEntry *>(data);
		D_ASSERT(catalog_entry->HasParent());
		CatalogSet::UpdateTimestamp(catalog_entry->Parent(), transaction_id);
		if (catalog_entry->name != catalog_entry->Parent().name) {
			CatalogSet::UpdateTimestamp(*catalog_entry, transaction_id);
		}
		break;
	}
	case UndoFlags::INSERT_TUPLE: {
		auto info = reinterpret_cast<AppendInfo *>(data);
		// revert this append
		info->table->RevertAppend(transaction, info->start_row, info->count);
		break;
	}
	case UndoFlags::DELETE_TUPLE: {
		// deletion:
		auto info = reinterpret_cast<DeleteInfo *>(data);
		// revert the commit by writing the (uncommitted) transaction_id back into the version info
		info->version_info->CommitDelete(info->vector_idx, transaction_id, *info);
		break;
	}
	case UndoFlags::UPDATE_TUPLE: {
		// update:
		auto info = reinterpret_cast<UpdateInfo *>(data);
		info->version_number = transaction_id;
		break;
	}
	case UndoFlags::SEQUENCE_VALUE: {
		break;
	}
	default:
		throw InternalException("UndoBuffer - don't know how to revert commit of this type!");
	}
}